

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_whitespaces(void)

{
  mpc_parser_t *pmVar1;
  
  pmVar1 = mpc_whitespace();
  pmVar1 = mpc_many(mpcf_strfold,pmVar1);
  pmVar1 = mpc_expect(pmVar1,"spaces");
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_whitespaces(void) { return mpc_expect(mpc_many(mpcf_strfold, mpc_whitespace()), "spaces"); }